

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O0

bool __thiscall
cppcms::anon_unknown_0::
base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::dispatch(base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           *this,string *url,char *method,application *param_4)

{
  bool bVar1;
  option *in_RCX;
  string *in_RDI;
  base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  *in_stack_00000030;
  char *in_stack_ffffffffffffffc8;
  
  bVar1 = option::matches(in_RCX,in_RDI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    execute_handler(in_stack_00000030,(handler1 *)this);
  }
  return bVar1;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					execute_handler(handle_);
					return true;
				}
				return false;
			}